

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int walIndexPage(Wal *pWal,int iPage,u32 **ppPage)

{
  u32 **pOld;
  int iVar1;
  uint uVar2;
  int iVar3;
  u32 **nBytes;
  u32 *__s;
  long lVar4;
  
  lVar4 = (long)iPage;
  if (pWal->nWiData <= iPage) {
    pOld = pWal->apWiData;
    iVar1 = sqlite3_initialize();
    nBytes = (u32 **)0x0;
    iVar3 = (int)(lVar4 + 1);
    if (iVar1 == 0) {
      uVar2 = iVar3 * 8;
      if (0 < (int)uVar2) {
        nBytes = (u32 **)(ulong)uVar2;
      }
      nBytes = (u32 **)sqlite3Realloc(pOld,(u64)nBytes);
    }
    if (nBytes == (u32 **)0x0) {
      *ppPage = (u32 *)0x0;
      return 7;
    }
    memset(nBytes + pWal->nWiData,0,((lVar4 + 1) - (long)pWal->nWiData) * 8);
    pWal->apWiData = nBytes;
    pWal->nWiData = iVar3;
  }
  iVar3 = 0;
  if (pWal->apWiData[lVar4] == (u32 *)0x0) {
    if (pWal->exclusiveMode == '\x02') {
      __s = (u32 *)sqlite3Malloc(0x8000);
      if (__s != (u32 *)0x0) {
        memset(__s,0,0x8000);
      }
      pWal->apWiData[lVar4] = __s;
      iVar3 = 7;
      if (pWal->apWiData[lVar4] != (u32 *)0x0) {
        iVar3 = 0;
      }
    }
    else {
      iVar3 = (*pWal->pDbFd->pMethods->xShmMap)
                        (pWal->pDbFd,iPage,0x8000,(int)pWal->writeLock,pWal->apWiData + lVar4);
      if (iVar3 == 8) {
        pWal->readOnly = pWal->readOnly | 2;
        iVar3 = 0;
      }
    }
  }
  *ppPage = pWal->apWiData[lVar4];
  return iVar3;
}

Assistant:

static int walIndexPage(Wal *pWal, int iPage, volatile u32 **ppPage){
  int rc = SQLITE_OK;

  /* Enlarge the pWal->apWiData[] array if required */
  if( pWal->nWiData<=iPage ){
    int nByte = sizeof(u32*)*(iPage+1);
    volatile u32 **apNew;
    apNew = (volatile u32 **)sqlite3_realloc((void *)pWal->apWiData, nByte);
    if( !apNew ){
      *ppPage = 0;
      return SQLITE_NOMEM;
    }
    memset((void*)&apNew[pWal->nWiData], 0,
           sizeof(u32*)*(iPage+1-pWal->nWiData));
    pWal->apWiData = apNew;
    pWal->nWiData = iPage+1;
  }

  /* Request a pointer to the required page from the VFS */
  if( pWal->apWiData[iPage]==0 ){
    if( pWal->exclusiveMode==WAL_HEAPMEMORY_MODE ){
      pWal->apWiData[iPage] = (u32 volatile *)sqlite3MallocZero(WALINDEX_PGSZ);
      if( !pWal->apWiData[iPage] ) rc = SQLITE_NOMEM;
    }else{
      rc = sqlite3OsShmMap(pWal->pDbFd, iPage, WALINDEX_PGSZ, 
          pWal->writeLock, (void volatile **)&pWal->apWiData[iPage]
      );
      if( rc==SQLITE_READONLY ){
        pWal->readOnly |= WAL_SHM_RDONLY;
        rc = SQLITE_OK;
      }
    }
  }

  *ppPage = pWal->apWiData[iPage];
  assert( iPage==0 || *ppPage || rc!=SQLITE_OK );
  return rc;
}